

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O1

fruit * loadfruitchn(memfile *mf)

{
  int32_t iVar1;
  int32_t iVar2;
  fruit *buf;
  fruit *pfVar3;
  fruit *pfVar4;
  
  mfmagic_check(mf,0x48435246);
  iVar1 = mread32(mf);
  if (iVar1 == 0) {
    buf = (fruit *)0x0;
  }
  else {
    pfVar3 = (fruit *)0x0;
    do {
      buf = (fruit *)malloc(0x30);
      mread(mf,buf,0x20);
      iVar2 = mread32(mf);
      buf->fid = iVar2;
      buf->nextf = pfVar3;
      iVar1 = iVar1 + -1;
      pfVar3 = buf;
    } while (iVar1 != 0);
  }
  if (buf == (fruit *)0x0) {
    pfVar3 = (fruit *)0x0;
  }
  else {
    pfVar4 = (fruit *)0x0;
    do {
      pfVar3 = buf;
      buf = pfVar3->nextf;
      pfVar3->nextf = pfVar4;
      pfVar4 = pfVar3;
    } while (buf != (fruit *)0x0);
  }
  return pfVar3;
}

Assistant:

static struct fruit *loadfruitchn(struct memfile *mf)
{
	struct fruit *flist = NULL, *fnext, *fcurr, *fprev;
	unsigned int count;

	mfmagic_check(mf, FRUITCHAIN_MAGIC);
	count = mread32(mf);
	while (count--) {
	    fnext = newfruit();
	    mread(mf, fnext->fname, sizeof(fnext->fname));
	    fnext->fid = mread32(mf);
	    fnext->nextf = flist;
	    flist = fnext;
	}

	/* fruit list loaded above is reversed, so put it back in the right order */
	fcurr = flist;
	fprev = NULL;
	while (fcurr) {
	    fnext = fcurr->nextf;
	    fcurr->nextf = fprev;
	    fprev = fcurr;
	    fcurr = fnext;
	}
	flist = fprev;

	return flist;
}